

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_request_paste(Terminal *term,wchar_t clipboard)

{
  if (clipboard == L'\0') {
    return;
  }
  if (clipboard == L'\x01') {
    queue_toplevel_callback(paste_from_clip_local,term);
    return;
  }
  (*term->win->vt->clip_request_paste)(term->win,clipboard);
  return;
}

Assistant:

void term_request_paste(Terminal *term, int clipboard)
{
    switch (clipboard) {
      case CLIP_NULL:
        /* Do nothing: CLIP_NULL never has data in it. */
        break;
      case CLIP_LOCAL:
        queue_toplevel_callback(paste_from_clip_local, term);
        break;
      default:
        win_clip_request_paste(term->win, clipboard);
        break;
    }
}